

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rate_adaptive_code.cpp
# Opt level: O2

void __thiscall
rate_adaptive_code_from_colptr_rowIdx_decode_infer_rate_Test::
rate_adaptive_code_from_colptr_rowIdx_decode_infer_rate_Test
          (rate_adaptive_code_from_colptr_rowIdx_decode_infer_rate_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0019ccf8;
  return;
}

Assistant:

TEST(rate_adaptive_code_from_colptr_rowIdx, decode_infer_rate) {
    auto H = get_code_big_wra();

    std::vector<Bit> x = get_bitstring(H.getNCols()); // true data to be sent

    // storage for syndrome. Initialize with arbitrary values, which must be overwritten by encoder.
    std::vector<Bit> syndrome;
    constexpr double rate_adapt_factor = .95;
    const auto output_syndr_len = static_cast<size_t>(
            static_cast<double>(H.get_n_rows_mother_matrix()) * rate_adapt_factor);
    H.encode_with_ra(x, syndrome, output_syndr_len);

    constexpr double p = 0.005;
    std::vector<bool> x_noised = x; // copy for distorted data
    noise_bitstring_inplace(x_noised, p);
    ASSERT_FALSE(x_noised == x);  // actually have errors to be corrected!

    double vlog = log((1 - p) / p);
    std::vector<double> llrs(x.size());
    for (std::size_t i{}; i < llrs.size(); ++i) {
        llrs[i] = vlog * (1 - 2 * x_noised[i]); // log likelihood ratios
    }

    std::vector<bool> prediction;
    bool success = H.decode_infer_rate(llrs, syndrome, prediction);

    ASSERT_TRUE(success);
    ASSERT_EQ(prediction, x);
}